

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O2

FRAME_STATS *
accumulate_frame_stats
          (FRAME_STATS *__return_storage_ptr__,FRAME_STATS *mb_stats,int mb_rows,int mb_cols)

{
  long *plVar1;
  undefined8 uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  double *pdVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  double dVar22;
  long lVar23;
  long lVar24;
  double dVar25;
  double dVar26;
  int local_5c;
  int64_t local_58;
  
  *(undefined8 *)&__return_storage_ptr__->second_ref_count = 0;
  uVar12 = 0;
  uVar4 = 0;
  if (0 < mb_cols) {
    uVar4 = (ulong)(uint)mb_cols;
  }
  uVar7 = (ulong)(uint)mb_rows;
  if (mb_rows < 1) {
    uVar7 = uVar12;
  }
  pdVar10 = &mb_stats->intra_factor;
  lVar23 = 0;
  lVar24 = 0;
  iVar20 = 0;
  iVar21 = 0;
  dVar25 = 0.0;
  dVar26 = 0.0;
  iVar5 = -1;
  dVar22 = 0.0;
  local_58 = 0;
  local_5c = 0;
  iVar14 = 0;
  lVar8 = 0;
  iVar9 = 0;
  iVar19 = 0;
  iVar17 = 0;
  lVar15 = 0;
  iVar13 = 0;
  iVar11 = 0;
  iVar6 = 0;
  lVar16 = 0;
  for (; uVar12 != uVar7; uVar12 = uVar12 + 1) {
    for (lVar18 = 0; uVar4 * 0x78 != lVar18; lVar18 = lVar18 + 0x78) {
      iVar3 = *(int *)((long)pdVar10 + lVar18 + -0x2c);
      if (iVar3 == -1) {
        iVar3 = iVar5;
      }
      if (iVar5 == -1) {
        iVar5 = iVar3;
      }
      plVar1 = (long *)((long)pdVar10 + lVar18 + -0x60);
      uVar2 = *(undefined8 *)((long)pdVar10 + lVar18 + -0x48);
      lVar16 = lVar16 + *(long *)((long)pdVar10 + lVar18 + -0x68);
      lVar23 = lVar23 + *plVar1;
      lVar24 = lVar24 + plVar1[1];
      dVar25 = dVar25 + *(double *)((long)pdVar10 + lVar18);
      dVar26 = dVar26 + ((double *)((long)pdVar10 + lVar18))[1];
      iVar6 = iVar6 + *(int *)((long)pdVar10 + lVar18 + -0x30);
      dVar22 = dVar22 + *(double *)((long)pdVar10 + lVar18 + -0x38);
      iVar11 = iVar11 + *(int *)((long)pdVar10 + lVar18 + -0x28);
      iVar13 = iVar13 + *(int *)((long)pdVar10 + lVar18 + -0x40);
      lVar15 = lVar15 + *(long *)((long)pdVar10 + lVar18 + -0x50);
      iVar17 = iVar17 + *(int *)((long)pdVar10 + lVar18 + -0x24);
      iVar19 = iVar19 + *(int *)((long)pdVar10 + lVar18 + -0x1c);
      iVar9 = iVar9 + *(int *)((long)pdVar10 + lVar18 + -0x14);
      lVar8 = lVar8 + *(long *)((long)pdVar10 + lVar18 + -8);
      iVar14 = iVar14 + *(int *)((long)pdVar10 + lVar18 + -0x20);
      local_5c = local_5c + *(int *)((long)pdVar10 + lVar18 + -0x18);
      iVar20 = iVar20 + (int)uVar2;
      iVar21 = iVar21 + (int)((ulong)uVar2 >> 0x20);
      local_58 = local_58 + *(long *)((long)pdVar10 + lVar18 + -0x10);
    }
    pdVar10 = pdVar10 + (long)mb_cols * 0xf;
  }
  __return_storage_ptr__->frame_avg_wavelet_energy = lVar23;
  __return_storage_ptr__->coded_error = lVar24;
  __return_storage_ptr__->intra_factor = dVar25;
  __return_storage_ptr__->brightness_factor = dVar26;
  __return_storage_ptr__->intra_skip_count = iVar6;
  __return_storage_ptr__->mv_count = iVar20;
  __return_storage_ptr__->inter_count = iVar21;
  __return_storage_ptr__->neutral_count = dVar22;
  __return_storage_ptr__->new_mv_count = iVar11;
  __return_storage_ptr__->second_ref_count = iVar13;
  __return_storage_ptr__->sr_coded_error = lVar15;
  __return_storage_ptr__->sum_in_vectors = iVar17;
  __return_storage_ptr__->sum_mvc = iVar19;
  __return_storage_ptr__->sum_mvc_abs = iVar9;
  __return_storage_ptr__->sum_mvcs = lVar8;
  __return_storage_ptr__->sum_mvr = iVar14;
  __return_storage_ptr__->sum_mvr_abs = local_5c;
  __return_storage_ptr__->sum_mvrs = local_58;
  __return_storage_ptr__->image_data_start_row = iVar5;
  __return_storage_ptr__->intra_error = lVar16;
  return __return_storage_ptr__;
}

Assistant:

static FRAME_STATS accumulate_frame_stats(FRAME_STATS *mb_stats, int mb_rows,
                                          int mb_cols) {
  FRAME_STATS stats = { 0 };
  int i, j;

  stats.image_data_start_row = INVALID_ROW;
  for (j = 0; j < mb_rows; j++) {
    for (i = 0; i < mb_cols; i++) {
      FRAME_STATS mb_stat = mb_stats[j * mb_cols + i];
      stats.brightness_factor += mb_stat.brightness_factor;
      stats.coded_error += mb_stat.coded_error;
      stats.frame_avg_wavelet_energy += mb_stat.frame_avg_wavelet_energy;
      if (stats.image_data_start_row == INVALID_ROW &&
          mb_stat.image_data_start_row != INVALID_ROW) {
        stats.image_data_start_row = mb_stat.image_data_start_row;
      }
      stats.inter_count += mb_stat.inter_count;
      stats.intra_error += mb_stat.intra_error;
      stats.intra_factor += mb_stat.intra_factor;
      stats.intra_skip_count += mb_stat.intra_skip_count;
      stats.mv_count += mb_stat.mv_count;
      stats.neutral_count += mb_stat.neutral_count;
      stats.new_mv_count += mb_stat.new_mv_count;
      stats.second_ref_count += mb_stat.second_ref_count;
      stats.sr_coded_error += mb_stat.sr_coded_error;
      stats.sum_in_vectors += mb_stat.sum_in_vectors;
      stats.sum_mvc += mb_stat.sum_mvc;
      stats.sum_mvc_abs += mb_stat.sum_mvc_abs;
      stats.sum_mvcs += mb_stat.sum_mvcs;
      stats.sum_mvr += mb_stat.sum_mvr;
      stats.sum_mvr_abs += mb_stat.sum_mvr_abs;
      stats.sum_mvrs += mb_stat.sum_mvrs;
    }
  }
  return stats;
}